

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall
cmLocalGenerator::AddGeneratorTarget
          (cmLocalGenerator *this,
          unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *gt)

{
  cmGeneratorTarget *this_00;
  string *psVar1;
  cmGeneratorTarget *gt_ptr;
  _Head_base<0UL,_cmGeneratorTarget_*,_false> local_28;
  
  this_00 = (gt->_M_t).
            super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>._M_t.
            super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>.
            super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl;
  local_28._M_head_impl = this_00;
  std::
  vector<std::unique_ptr<cmGeneratorTarget,std::default_delete<cmGeneratorTarget>>,std::allocator<std::unique_ptr<cmGeneratorTarget,std::default_delete<cmGeneratorTarget>>>>
  ::emplace_back<std::unique_ptr<cmGeneratorTarget,std::default_delete<cmGeneratorTarget>>>
            ((vector<std::unique_ptr<cmGeneratorTarget,std::default_delete<cmGeneratorTarget>>,std::allocator<std::unique_ptr<cmGeneratorTarget,std::default_delete<cmGeneratorTarget>>>>
              *)&this->GeneratorTargets,gt);
  psVar1 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGeneratorTarget*>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::__cxx11::string_const&,cmGeneratorTarget*&>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGeneratorTarget*>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&this->GeneratorTargetSearchIndex,psVar1,&local_28);
  cmGlobalGenerator::IndexGeneratorTarget(this->GlobalGenerator,local_28._M_head_impl);
  return;
}

Assistant:

void cmLocalGenerator::AddGeneratorTarget(
  std::unique_ptr<cmGeneratorTarget> gt)
{
  cmGeneratorTarget* gt_ptr = gt.get();

  this->GeneratorTargets.push_back(std::move(gt));
  this->GeneratorTargetSearchIndex.emplace(gt_ptr->GetName(), gt_ptr);
  this->GlobalGenerator->IndexGeneratorTarget(gt_ptr);
}